

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher.cpp
# Opt level: O2

void __thiscall cppnet::Dispatcher::StopTimer(Dispatcher *this,uint32_t timer_id)

{
  long lVar1;
  element_type *peVar2;
  pthread_t pVar3;
  iterator __it;
  long *in_FS_OFFSET;
  __weak_ptr<cppnet::TimerSlot,(__gnu_cxx::_Lock_policy)2> a_Stack_58 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  pVar3 = pthread_self();
  if (pVar3 == (this->_local_thread_id)._M_thread) {
    __all_timer_event_map::__tls_init();
    lVar1 = *in_FS_OFFSET;
    local_48._M_unused._M_object = (void *)(ulong)timer_id;
    __it = std::
           _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cppnet::TimerEvent>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::TimerEvent>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cppnet::TimerEvent>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::TimerEvent>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)(lVar1 + -0xc0),(key_type *)local_48._M_pod_data);
    __all_timer_event_map::__tls_init();
    if (__it.
        super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::TimerEvent>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      peVar2 = (this->_timer).super___shared_ptr<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__weak_ptr<cppnet::TimerSlot,(__gnu_cxx::_Lock_policy)2>::
      __weak_ptr<cppnet::TimerEvent,void>
                (a_Stack_58,
                 (__shared_ptr<cppnet::TimerEvent,_(__gnu_cxx::_Lock_policy)2> *)
                 ((long)__it.
                        super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::TimerEvent>_>,_false>
                        ._M_cur + 0x10));
      (*peVar2->_vptr_Timer[1])(peVar2,a_Stack_58);
      std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_50);
      __all_timer_event_map::__tls_init();
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cppnet::TimerEvent>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::TimerEvent>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::erase((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cppnet::TimerEvent>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::TimerEvent>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)(lVar1 + -0xc0),
              (const_iterator)
              __it.
              super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::TimerEvent>_>,_false>
              ._M_cur);
    }
  }
  else {
    local_48._4_4_ = 0;
    local_48._0_4_ = timer_id;
    local_30 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/dispatcher.cpp:186:21)>
               ::_M_invoke;
    local_38 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/dispatcher.cpp:186:21)>
               ::_M_manager;
    local_48._8_8_ = this;
    PostTask(this,(Task *)&local_48);
    std::_Function_base::~_Function_base((_Function_base *)&local_48);
  }
  return;
}

Assistant:

void Dispatcher::StopTimer(uint32_t timer_id) {
    if (std::this_thread::get_id() == _local_thread_id) {
        auto iter = __all_timer_event_map.find(timer_id);
        if (iter == __all_timer_event_map.end()) {
            return;
        }
        
        _timer->RmTimer(iter->second);
        __all_timer_event_map.erase(iter);

    } else {
        auto task = [timer_id, this]() {
            auto iter = __all_timer_event_map.find(timer_id);
            if (iter == __all_timer_event_map.end()) {
                return;
            }

            _timer->RmTimer(iter->second);
            __all_timer_event_map.erase(iter);
        };
        PostTask(task);
    }
}